

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

void openInputIntervals(string *fPath,
                       vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                       *inp)

{
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  long *plVar4;
  int en;
  int st;
  string chr;
  fstream fs;
  _Head_base<2UL,_int,_false> local_290;
  int local_28c;
  undefined1 local_288 [8];
  _Alloc_hider local_280;
  char local_270 [16];
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  string local_240 [528];
  
  std::fstream::fstream(local_240);
  std::fstream::open(local_240,(_Ios_Openmode)fPath);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not find input regions file at: ",0x26);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fPath->_M_dataplus)._M_p,fPath->_M_string_length);
    local_288[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_288,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"        Input regions file: ",0x1c);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fPath->_M_dataplus)._M_p,fPath->_M_string_length);
    local_288[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_288,1);
    local_260 = local_250;
    local_258 = 0;
    local_250[0] = 0;
    while( true ) {
      piVar3 = std::operator>>((istream *)local_240,(string *)&local_260);
      piVar3 = (istream *)std::istream::operator>>(piVar3,&local_28c);
      plVar4 = (long *)std::istream::operator>>(piVar3,&local_290._M_head_impl);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
      local_288._0_4_ = local_290._M_head_impl;
      local_288._4_4_ = local_28c;
      local_280._M_p = local_270;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,local_260,local_260 + local_258);
      std::
      vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
      ::emplace_back<std::tuple<std::__cxx11::string,int,int>>
                ((vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
                  *)inp,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                         *)local_288);
      if (local_280._M_p != local_270) {
        operator_delete(local_280._M_p);
      }
    }
    std::fstream::close();
    if (local_260 != local_250) {
      operator_delete(local_260);
    }
  }
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void openInputIntervals(const std::string &fPath, std::vector<std::tuple<std::string, int, int>> &inp)
{
	std::fstream fs;
	fs.open(fPath, std::fstream::in);
	if (!fs.is_open())
	{
		std::cerr << "Could not find input regions file at: " << fPath << '\n';
		return;
	}
	else
	{
		std::cerr << "        Input regions file: " << fPath << '\n';
	}

	std::string chr;
	int st, en;

	while (fs >> chr >> st >> en)
	{
		inp.emplace_back(std::make_tuple(chr, st, en));
	}
	fs.close();
}